

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::HttpServer::Connection::LoopResult> * __thiscall
kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::
await_transform<kj::Promise<kj::HttpServer::Connection::LoopResult>&>
          (Coroutine<kj::HttpServer::Connection::LoopResult> *this,
          Promise<kj::HttpServer::Connection::LoopResult> *awaitable)

{
  Promise<kj::HttpServer::Connection::LoopResult> *pPVar1;
  Promise<kj::HttpServer::Connection::LoopResult> *awaitable_local;
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_local;
  
  pPVar1 = fwd<kj::Promise<kj::HttpServer::Connection::LoopResult>&>(awaitable);
  return pPVar1;
}

Assistant:

U&& await_transform(U&& awaitable) {
    // Our `await_transform()` implementation is where we can instrument awaitables, or provide
    // custom awaiter implementations, if we need to. Historically, this _is_ where we created
    // awaiter implementations (that is, the classes with `await_ready()`, `await_suspend()`, and
    // `await_resume()` member functions), because this was the only place we knew the enclosing
    // `Coroutine<T>` type. Nowadays, `await_suspend()` can be a template, allowing us to infer
    // the enclosing coroutine type that way.
    //
    // We cannot get rid of `await_transform()`, because downstream projects can (and do) implement
    // custom coroutine implementations which wrap this implementation, and they use
    // `await_transform()` to pass unrecognized awaitables through to us -- and if an
    // `await_transform()` implementation exists for one awaitable types, then the compiler requires
    // that it exist for all awaitable types `co_await`ed from within this coroutine.
    //
    // So, we just pass through all awaitables unchanged for now, deferring to their
    // `operator co_await` implementations to instantiate the awaiters.
    //
    // TODO(someday): We could implement an `await_transform()` overload which wraps awaitables (e.g.
    //   Promise, ForkedPromise, and whatever else comes along in the future) in a struct containing
    //   the awaitable plus a reference to our CoroutineBase. The awaitables' `co_await`
    //   implementation could accept this struct and pass the CoroutineBase reference to the actual
    //   awaiter implementation's constructor (e.g. PromiseAwaiter), which would give us access to
    //   the coroutine in `await_ready()`. This would allow us to decide whether to apply the
    //   immediately-ready-promise optimization earlier, before suspension.
    return kj::fwd<U>(awaitable);
  }